

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O2

string * __thiscall
t_perl_generator::get_namespace_out_dir_abi_cxx11_
          (string *__return_storage_ptr__,t_perl_generator *this)

{
  _List_node_base *p_Var1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dirs;
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])();
  local_60._M_impl._M_node._M_size = 0;
  local_60._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_60;
  local_60._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_60;
  perl_namespace_dirs(this,(this->super_t_oop_generator).super_t_generator.program_,
                      (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_60);
  p_Var1 = (_List_node_base *)&local_60;
  while (p_Var1 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)&local_60) {
    std::operator+(&local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 1)
                   ,"/");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_48);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string get_namespace_out_dir() {
    std::string outdir = get_out_dir();
    std::list<std::string> dirs;
    perl_namespace_dirs(program_, dirs);
    std::list<std::string>::iterator it;
    for (it = dirs.begin(); it != dirs.end(); it++) {
      outdir += *it + "/";
    }
    return outdir;
  }